

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product.h
# Opt level: O2

void __thiscall Shoes::~Shoes(Shoes *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Shoes() {}